

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rotate(lua_State *L,int idx,int n)

{
  lu_byte lVar1;
  Value VVar2;
  TValue *io2_5;
  StkId pSVar3;
  TValue *io2_4;
  StkId pSVar4;
  StkId pSVar5;
  StkId pSVar6;
  StkId pSVar7;
  
  if (idx < 1) {
    pSVar4 = (L->top).p + idx;
  }
  else {
    pSVar4 = (L->ci->func).p + (uint)idx;
  }
  pSVar3 = (L->top).p + -1;
  if (n < 0) {
    pSVar5 = pSVar4 + (-1 - (long)n);
  }
  else {
    pSVar5 = pSVar3 + -(ulong)(uint)n;
  }
  pSVar6 = pSVar4;
  pSVar7 = pSVar5;
  if (pSVar4 < pSVar5) {
    do {
      VVar2 = (pSVar6->val).value_;
      lVar1 = (pSVar6->val).tt_;
      (pSVar6->val).value_ = (pSVar7->val).value_;
      (pSVar6->val).tt_ = (pSVar7->val).tt_;
      (pSVar7->val).value_ = VVar2;
      (pSVar7->val).tt_ = lVar1;
      pSVar6 = pSVar6 + 1;
      pSVar7 = pSVar7 + -1;
    } while (pSVar6 < pSVar7);
  }
  pSVar5 = pSVar5 + 1;
  pSVar6 = pSVar3;
  if (pSVar5 < pSVar3) {
    do {
      VVar2 = (pSVar5->val).value_;
      lVar1 = (pSVar5->val).tt_;
      (pSVar5->val).value_ = (pSVar6->val).value_;
      (pSVar5->val).tt_ = (pSVar6->val).tt_;
      (pSVar6->val).value_ = VVar2;
      (pSVar6->val).tt_ = lVar1;
      pSVar5 = pSVar5 + 1;
      pSVar6 = pSVar6 + -1;
    } while (pSVar5 < pSVar6);
  }
  for (; pSVar4 < pSVar3; pSVar4 = pSVar4 + 1) {
    VVar2 = (pSVar4->val).value_;
    lVar1 = (pSVar4->val).tt_;
    (pSVar4->val).value_ = (pSVar3->val).value_;
    (pSVar4->val).tt_ = (pSVar3->val).tt_;
    (pSVar3->val).value_ = VVar2;
    (pSVar3->val).tt_ = lVar1;
    pSVar3 = pSVar3 + -1;
  }
  return;
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top.p - 1;  /* end of stack segment being rotated */
  p = index2stack(L, idx);  /* start of segment */
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}